

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::ResolveImageToImage::copyMSImageToMSImage(ResolveImageToImage *this)

{
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  deUint64 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  VkImageAspectFlags VVar6;
  VkImageAspectFlags VVar7;
  VkResult VVar8;
  DeviceInterface *vk_00;
  VkDevice device;
  VkQueue queue_00;
  TextureFormat format;
  Handle<(vk::HandleType)9> *pHVar9;
  VkCommandBuffer_s **ppVVar10;
  size_type sVar11;
  VkImageCopy *pVVar12;
  VkExtent3D VVar13;
  undefined4 uVar14;
  undefined8 in_stack_fffffffffffffd00;
  uint uVar15;
  undefined8 uStack_1f8;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  undefined4 local_1d0 [2];
  VkImageMemoryBarrier postImageBarriers;
  undefined4 local_178 [2];
  VkImageMemoryBarrier imageBarriers [2];
  deUint32 local_e0;
  undefined1 auStack_d8 [8];
  VkImageCopy imageCopy;
  VkImageSubresourceLayers destinationSubresourceLayers;
  VkImageSubresourceLayers sourceSubresourceLayers;
  deUint32 layerNdx;
  vector<vk::VkImageCopy,_std::allocator<vk::VkImageCopy>_> imageCopies;
  TextureFormat srcTcuFormat;
  VkQueue queue;
  VkDevice vkDevice;
  DeviceInterface *vk;
  ResolveImageToImage *this_local;
  
  vk_00 = Context::getDeviceInterface
                    ((this->super_CopiesAndBlittingTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_CopiesAndBlittingTestInstance).super_TestInstance.
                              m_context);
  queue_00 = Context::getUniversalQueue
                       ((this->super_CopiesAndBlittingTestInstance).super_TestInstance.m_context);
  format = ::vk::mapVkFormat((this->super_CopiesAndBlittingTestInstance).m_params.src.image.format);
  std::vector<vk::VkImageCopy,_std::allocator<vk::VkImageCopy>_>::vector
            ((vector<vk::VkImageCopy,_std::allocator<vk::VkImageCopy>_> *)
             &sourceSubresourceLayers.layerCount);
  sourceSubresourceLayers.baseArrayLayer = 0;
  while( true ) {
    dVar4 = sourceSubresourceLayers.baseArrayLayer;
    dVar5 = getArraySize(&(this->super_CopiesAndBlittingTestInstance).m_params.dst.image);
    uVar15 = (uint)((ulong)in_stack_fffffffffffffd00 >> 0x20);
    if (dVar5 <= dVar4) break;
    VVar6 = getAspectFlags(format);
    sourceSubresourceLayers.aspectMask = 0;
    sourceSubresourceLayers.mipLevel = 1;
    unique0x1000077f = format;
    VVar7 = getAspectFlags(format);
    auStack_d8 = (undefined1  [8])(ulong)VVar6;
    imageCopy.srcSubresource.mipLevel = sourceSubresourceLayers.mipLevel;
    imageCopy.srcSubresource.aspectMask = sourceSubresourceLayers.aspectMask;
    imageCopy.srcSubresource.baseArrayLayer = 0;
    imageCopy.srcSubresource.layerCount = 0;
    imageCopy.srcOffset.x = 0;
    imageCopy.srcOffset._4_8_ = ZEXT48(VVar7);
    imageCopy.dstSubresource.mipLevel = 1;
    imageCopy.dstSubresource.aspectMask = sourceSubresourceLayers.baseArrayLayer;
    imageCopy.dstSubresource.baseArrayLayer = 0;
    imageCopy.dstSubresource.layerCount = 0;
    imageCopy.dstOffset.x = 0;
    VVar13 = getExtent3D((ImageParms *)&(this->super_CopiesAndBlittingTestInstance).m_params);
    local_e0 = VVar13.depth;
    imageCopy.extent.width = local_e0;
    imageBarriers[1]._64_8_ = VVar13._0_8_;
    imageCopy.dstOffset.y = imageBarriers[1].subresourceRange.layerCount;
    imageCopy.dstOffset.z = imageBarriers[1]._68_4_;
    unique0x10000773 = VVar13;
    std::vector<vk::VkImageCopy,_std::allocator<vk::VkImageCopy>_>::push_back
              ((vector<vk::VkImageCopy,_std::allocator<vk::VkImageCopy>_> *)
               &sourceSubresourceLayers.layerCount,(value_type *)auStack_d8);
    sourceSubresourceLayers.baseArrayLayer = sourceSubresourceLayers.baseArrayLayer + 1;
  }
  local_178[0] = 0x2d;
  imageBarriers[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageBarriers[0]._4_4_ = 0;
  imageBarriers[0].pNext._0_4_ = 0x100;
  imageBarriers[0].pNext._4_4_ = 0x800;
  imageBarriers[0].srcAccessMask = 2;
  imageBarriers[0].dstAccessMask = 6;
  imageBarriers[0].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  imageBarriers[0].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::get
                     (&(this->m_multisampledImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  imageBarriers[0]._32_8_ = pHVar9->m_internal;
  imageBarriers[0].image.m_internal._0_4_ = getAspectFlags(format);
  imageBarriers[0].image.m_internal._4_4_ = 0;
  imageBarriers[0].subresourceRange.aspectMask = 1;
  imageBarriers[0].subresourceRange.baseMipLevel = 0;
  imageBarriers[0].subresourceRange.levelCount =
       getArraySize((ImageParms *)&(this->super_CopiesAndBlittingTestInstance).m_params);
  imageBarriers[0].subresourceRange.layerCount = 0x2d;
  imageBarriers[1].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageBarriers[1]._4_4_ = 0;
  imageBarriers[1].pNext._0_4_ = 0;
  imageBarriers[1].pNext._4_4_ = 0x1000;
  imageBarriers[1].srcAccessMask = 0;
  imageBarriers[1].dstAccessMask = 7;
  imageBarriers[1].oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  imageBarriers[1].newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::get
                     (&(this->m_multisampledCopyImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>
                     );
  imageBarriers[1]._32_8_ = pHVar9->m_internal;
  postImageBarriers._64_8_ = format;
  imageBarriers[1].image.m_internal._0_4_ = getAspectFlags(format);
  imageBarriers[1].image.m_internal._4_4_ = 0;
  imageBarriers[1].subresourceRange.aspectMask = 1;
  imageBarriers[1].subresourceRange.baseMipLevel = 0;
  imageBarriers[1].subresourceRange.levelCount =
       getArraySize(&(this->super_CopiesAndBlittingTestInstance).m_params.dst.image);
  local_1d0[0] = 0x2d;
  postImageBarriers.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarriers._4_4_ = 0;
  postImageBarriers.pNext._0_4_ = 0x1000;
  postImageBarriers.pNext._4_4_ = 0x100;
  postImageBarriers.srcAccessMask = 7;
  postImageBarriers.dstAccessMask = 2;
  postImageBarriers.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarriers.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::get
                     (&(this->m_multisampledCopyImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>
                     );
  postImageBarriers._32_8_ = pHVar9->m_internal;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)format;
  postImageBarriers.image.m_internal._0_4_ = getAspectFlags(format);
  postImageBarriers.image.m_internal._4_4_ = 0;
  postImageBarriers.subresourceRange.aspectMask = 1;
  postImageBarriers.subresourceRange.baseMipLevel = 0;
  postImageBarriers.subresourceRange.levelCount =
       getArraySize(&(this->super_CopiesAndBlittingTestInstance).m_params.dst.image);
  cmdBufferBeginInfo.pNext = (void *)0x1;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  uStack_1f8 = 0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_CopiesAndBlittingTestInstance).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar8 = (*vk_00->_vptr_DeviceInterface[0x49])(vk_00,*ppVVar10,&uStack_1f8);
  ::vk::checkResult(VVar8,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0xcc2);
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_CopiesAndBlittingTestInstance).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  uVar14 = 0;
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar10,0x1000,0x1000,0,0,0,(ulong)uVar15 << 0x20,0,2,local_178);
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_CopiesAndBlittingTestInstance).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar1 = *ppVVar10;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::get
                     (&(this->m_multisampledImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  dVar2 = pHVar9->m_internal;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::get
                     (&(this->m_multisampledCopyImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>
                     );
  dVar3 = pHVar9->m_internal;
  sVar11 = std::vector<vk::VkImageCopy,_std::allocator<vk::VkImageCopy>_>::size
                     ((vector<vk::VkImageCopy,_std::allocator<vk::VkImageCopy>_> *)
                      &sourceSubresourceLayers.layerCount);
  pVVar12 = std::vector<vk::VkImageCopy,_std::allocator<vk::VkImageCopy>_>::data
                      ((vector<vk::VkImageCopy,_std::allocator<vk::VkImageCopy>_> *)
                       &sourceSubresourceLayers.layerCount);
  (*vk_00->_vptr_DeviceInterface[0x60])
            (vk_00,pVVar1,dVar2,6,dVar3,7,CONCAT44(uVar14,(int)sVar11),pVVar12);
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_CopiesAndBlittingTestInstance).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar10,0x1000,0x2000,0,0,0,(ulong)pVVar12 & 0xffffffff00000000,0,1,local_1d0);
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_CopiesAndBlittingTestInstance).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar8 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar10);
  ::vk::checkResult(VVar8,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0xcc6);
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_CopiesAndBlittingTestInstance).m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  CopiesAndBlittingTestInstance::submitCommandsAndWait
            (&this->super_CopiesAndBlittingTestInstance,vk_00,device,queue_00,ppVVar10);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=
            (&this->m_multisampledImage,&this->m_multisampledCopyImage);
  std::vector<vk::VkImageCopy,_std::allocator<vk::VkImageCopy>_>::~vector
            ((vector<vk::VkImageCopy,_std::allocator<vk::VkImageCopy>_> *)
             &sourceSubresourceLayers.layerCount);
  return;
}

Assistant:

void ResolveImageToImage::copyMSImageToMSImage (void)
{
	const DeviceInterface&			vk					= m_context.getDeviceInterface();
	const VkDevice					vkDevice			= m_context.getDevice();
	const VkQueue					queue				= m_context.getUniversalQueue();
	const tcu::TextureFormat		srcTcuFormat		= mapVkFormat(m_params.src.image.format);
	std::vector<VkImageCopy>		imageCopies;

	for (deUint32 layerNdx = 0; layerNdx < getArraySize(m_params.dst.image); ++layerNdx)
	{
		const VkImageSubresourceLayers	sourceSubresourceLayers	=
		{
			getAspectFlags(srcTcuFormat),	// VkImageAspectFlags	aspectMask;
			0u,								// uint32_t				mipLevel;
			0u,								// uint32_t				baseArrayLayer;
			1u								// uint32_t				layerCount;
		};

		const VkImageSubresourceLayers	destinationSubresourceLayers	=
		{
			getAspectFlags(srcTcuFormat),	// VkImageAspectFlags	aspectMask;//getAspectFlags(dstTcuFormat)
			0u,								// uint32_t				mipLevel;
			layerNdx,						// uint32_t				baseArrayLayer;
			1u								// uint32_t				layerCount;
		};

		const VkImageCopy				imageCopy	=
		{
			sourceSubresourceLayers,			// VkImageSubresourceLayers	srcSubresource;
			{0, 0, 0},							// VkOffset3D				srcOffset;
			destinationSubresourceLayers,		// VkImageSubresourceLayers	dstSubresource;
			{0, 0, 0},							// VkOffset3D				dstOffset;
			 getExtent3D(m_params.src.image),	// VkExtent3D				extent;
		};
		imageCopies.push_back(imageCopy);
	}

	const VkImageMemoryBarrier		imageBarriers[]		=
	{
		//// source image
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// VkAccessFlags			srcAccessMask;
			VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,					// deUint32					dstQueueFamilyIndex;
			m_multisampledImage.get(),					// VkImage					image;
			{											// VkImageSubresourceRange	subresourceRange;
				getAspectFlags(srcTcuFormat),		// VkImageAspectFlags	aspectMask;
				0u,									// deUint32				baseMipLevel;
				1u,									// deUint32				mipLevels;
				0u,									// deUint32				baseArraySlice;
				getArraySize(m_params.src.image)	// deUint32				arraySize;
			}
		},
		// destination image
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0,											// VkAccessFlags			srcAccessMask;
			VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,					// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,		// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,					// deUint32					dstQueueFamilyIndex;
			m_multisampledCopyImage.get(),				// VkImage					image;
			{											// VkImageSubresourceRange	subresourceRange;
				getAspectFlags(srcTcuFormat),		// VkImageAspectFlags	aspectMask;
				0u,									// deUint32				baseMipLevel;
				1u,									// deUint32				mipLevels;
				0u,									// deUint32				baseArraySlice;
				getArraySize(m_params.dst.image)	// deUint32				arraySize;
			}
		},
	};

	const VkImageMemoryBarrier	postImageBarriers		=
	// source image
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags			srcAccessMask;
		VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,		// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					dstQueueFamilyIndex;
		m_multisampledCopyImage.get(),				// VkImage					image;
		{											// VkImageSubresourceRange	subresourceRange;
			getAspectFlags(srcTcuFormat),		// VkImageAspectFlags	aspectMask;
			0u,									// deUint32				baseMipLevel;
			1u,									// deUint32				mipLevels;
			0u,									// deUint32				baseArraySlice;
			getArraySize(m_params.dst.image)	// deUint32				arraySize;
		}
	};

	const VkCommandBufferBeginInfo	cmdBufferBeginInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,			// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, DE_LENGTH_OF_ARRAY(imageBarriers), imageBarriers);
	vk.cmdCopyImage(*m_cmdBuffer, m_multisampledImage.get(), VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, m_multisampledCopyImage.get(), VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, (deUint32)imageCopies.size(), imageCopies.data());
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &postImageBarriers);
	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));

	submitCommandsAndWait (vk, vkDevice, queue, *m_cmdBuffer);

	m_multisampledImage = m_multisampledCopyImage;
}